

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O3

Vec<Hpipe::Cond::Range> * __thiscall
Hpipe::Cond::ok_ranges_opt(Vec<Hpipe::Cond::Range> *__return_storage_ptr__,Cond *this,Cond *not_in)

{
  pointer pRVar1;
  iterator __position;
  int iVar2;
  Range *r;
  pointer pRVar3;
  ulong uVar4;
  Vec<Hpipe::Cond::Range> *__range2;
  int iVar5;
  pointer pRVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  Range local_50;
  
  (__return_storage_ptr__->super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
  super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
  super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
  super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (not_in == (Cond *)0x0) {
    local_50.beg = 0;
    do {
      uVar8 = (ulong)local_50.beg;
      iVar2 = local_50.beg;
      if (((this->p).super__Base_bitset<4UL>._M_w[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0) {
        do {
          uVar4 = uVar8;
          if (0xfe < (long)uVar4) {
            uVar8 = 0x100;
            local_50.end = 0xff;
            goto LAB_00143ad4;
          }
          uVar8 = uVar4 + 1;
        } while (((this->p).super__Base_bitset<4UL>._M_w[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0);
        local_50.end = (int)uVar4;
LAB_00143ad4:
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<Hpipe::Cond::Range,std::allocator<Hpipe::Cond::Range>>::
        emplace_back<Hpipe::Cond::Range_const&>
                  ((vector<Hpipe::Cond::Range,std::allocator<Hpipe::Cond::Range>> *)
                   __return_storage_ptr__,&local_50);
        iVar2 = (int)uVar8;
        if (local_50.exceptions.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            != (pointer)0x0) {
          operator_delete(local_50.exceptions.super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.exceptions.super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.exceptions.super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      local_50.beg = iVar2 + 1;
    } while (iVar2 < 0xff);
    pRVar3 = (__return_storage_ptr__->
             super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
             super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    iVar2 = 0;
    do {
      uVar8 = (ulong)iVar2;
      iVar7 = iVar2;
      if ((((this->p).super__Base_bitset<4UL>._M_w[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0) &&
         (((not_in->p).super__Base_bitset<4UL>._M_w[uVar8 >> 6] & 1L << ((byte)iVar2 & 0x3f)) == 0))
      {
        local_50.beg = -1;
        uVar4 = uVar8;
        do {
          uVar4 = uVar4 - 1;
          if (uVar4 == 0xffffffffffffffff) {
            local_50.beg = 0;
            goto LAB_0014398e;
          }
          local_50.beg = local_50.beg + 1;
        } while (((not_in->p).super__Base_bitset<4UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0);
        local_50.beg = iVar2 - local_50.beg;
LAB_0014398e:
        if (iVar2 < 0xff) {
          uVar8 = uVar8 + 1;
          do {
            iVar7 = (int)uVar8;
            if ((((this->p).super__Base_bitset<4UL>._M_w[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) &&
               (((not_in->p).super__Base_bitset<4UL>._M_w[uVar8 >> 6] & 1L << ((byte)uVar8 & 0x3f))
                == 0)) goto LAB_001439dc;
            uVar8 = uVar8 + 1;
            iVar2 = iVar7;
          } while (uVar8 != 0x100);
          uVar8 = 0x100;
          iVar2 = 0xff;
        }
        else {
          uVar8 = (ulong)(iVar2 + 1);
        }
LAB_001439dc:
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_50.end = iVar2;
        std::vector<Hpipe::Cond::Range,std::allocator<Hpipe::Cond::Range>>::
        emplace_back<Hpipe::Cond::Range_const&>
                  ((vector<Hpipe::Cond::Range,std::allocator<Hpipe::Cond::Range>> *)
                   __return_storage_ptr__,&local_50);
        iVar7 = (int)uVar8;
        if (local_50.exceptions.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            != (pointer)0x0) {
          operator_delete(local_50.exceptions.super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.exceptions.super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.exceptions.super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      iVar2 = iVar7 + 1;
    } while (iVar7 < 0xff);
    pRVar1 = (__return_storage_ptr__->
             super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
             super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pRVar6 = (__return_storage_ptr__->
             super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
             super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
             super__Vector_impl_data._M_start;
    pRVar3 = pRVar6;
    for (; pRVar6 != pRVar1; pRVar6 = pRVar6 + 1) {
      iVar7 = pRVar6->end + 1;
      iVar2 = pRVar6->beg;
      uVar8 = (ulong)iVar2;
      if (iVar7 - iVar2 != 1) {
        iVar5 = -1;
        if (iVar7 != iVar2) {
          do {
            if ((((not_in->p).super__Base_bitset<4UL>._M_w[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0)
               && (bVar11 = -1 < iVar5, iVar5 = (int)uVar8, bVar11)) goto LAB_00143a74;
            uVar8 = uVar8 + 1;
          } while ((long)pRVar6->end + 1U != uVar8);
        }
        pRVar6->beg = iVar5;
        pRVar6->end = iVar5;
      }
LAB_00143a74:
      pRVar3 = pRVar1;
    }
  }
  pRVar6 = (__return_storage_ptr__->
           super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
           super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)pRVar3 - (long)pRVar6)) {
    uVar10 = 1;
    uVar8 = 1;
    do {
      uVar9 = uVar10 - 1;
      local_50.beg = pRVar6[uVar9].end + 1;
      if ((1 < local_50.beg - pRVar6[uVar9].beg) && (pRVar6[uVar9].end + 2 == pRVar6[uVar8].beg)) {
        __position._M_current =
             *(pointer *)
              ((long)&pRVar6[uVar9].exceptions.super_vector<int,_std::allocator<int>_> + 8);
        if (__position._M_current ==
            *(pointer *)
             ((long)&pRVar6[uVar9].exceptions.super_vector<int,_std::allocator<int>_> + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&pRVar6[uVar9].exceptions,__position,
                     &local_50.beg);
        }
        else {
          *__position._M_current = local_50.beg;
          *(int **)((long)&pRVar6[uVar9].exceptions.super_vector<int,_std::allocator<int>_> + 8) =
               __position._M_current + 1;
        }
        pRVar3 = (__return_storage_ptr__->
                 super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
                 super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pRVar3[uVar9].end = pRVar3[uVar8].end;
        std::vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>::_M_erase
                  (&__return_storage_ptr__->
                    super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>,
                   pRVar3 + uVar8,pRVar3 + uVar8 + 1);
        pRVar6 = (__return_storage_ptr__->
                 super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
                 super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar10 = uVar9;
      }
      uVar10 = uVar10 + 1;
      uVar8 = (ulong)uVar10;
    } while (uVar8 < (ulong)((long)(__return_storage_ptr__->
                                   super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>
                                   ).
                                   super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar6 >> 5));
  }
  return __return_storage_ptr__;
}

Assistant:

Vec<Cond::Range> Cond::ok_ranges_opt( const Cond *not_in ) const {
    Vec<Range> ra;
    if ( not_in ) {
        for( int i = 0; i < p_size; ++i ) {
            // beginning if a Range
            if ( p[ i ] and not (*not_in)[ i ] ) {
                // leftest beg
                int beg = i++;
                while ( beg and (*not_in)[ beg - 1 ] )
                    --beg;
                // rightest end
                while ( i < p_size and ( p[ i ] or (*not_in)[ i ] ) )
                    ++i;
                // register the interval
                ra << Range( beg, i - 1 );
            }
        }

        // reduction of ranges with only 1 not not_in
        for( Range &r : ra ) {
            if ( r.size() == 1 )
                continue;
            for( int i = r.beg, p = -1; ; ++i ) {
                if ( i == r.end + 1 ) {
                    r.beg = p;
                    r.end = p;
                    break;
                }
                if ( not (*not_in)[ i ] ) {
                    if ( p >= 0 )
                        break;
                    p = i;
                }
            }
        }
    } else {
        for( int i = 0; i < p_size; ++i ) {
            // beginning if a Range
            if ( p[ i ] ) {
                int beg = i++;
                while ( i < p_size and p[ i ] )
                    ++i;
                ra << Range( beg, i - 1 );
            }
        }
    }

    // [ ... x - 1 ] | [ x + 1 ... ] if cardinal first interval > 1
    for( unsigned i = 1; i < ra.size(); ++i ) {
        if ( ra[ i - 1 ].size() >= 2 and ra[ i - 1 ].end + 2 == ra[ i ].beg ) {
            ra[ i - 1 ].exceptions << ra[ i - 1 ].end + 1;
            ra[ i - 1 ].end = ra[ i ].end;
            ra.remove( i-- );
        }
    }

    return ra;
}